

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O2

bool __thiscall catalog::newTable(catalog *this,TableInfo *tableInfo)

{
  ostream *poVar1;
  ofstream tablelist;
  
  this->tableNumber = this->tableNumber + 1;
  if (this->anychangeornot == false) {
    this->anychangeornot = true;
  }
  std::ofstream::ofstream(&tablelist,"./file/catalog/table.dat",_S_out|_S_in|_S_bin);
  poVar1 = std::operator<<((ostream *)&std::cout,"current table number : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->tableNumber);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::write((char *)&tablelist,(long)&this->tableNumber);
  writeTabletoFile(this,tableInfo,&tablelist);
  std::ofstream::close();
  addInfoToList(this,tableInfo);
  poVar1 = std::operator<<((ostream *)&std::cout,"create table successfully!");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&tablelist);
  return true;
}

Assistant:

bool catalog::newTable(TableInfo* tableInfo){
    tableNumber++; 
    if(anychangeornot == false)anychangeornot = true;
    std::ofstream tablelist("./file/catalog/table.dat", std::ios::out | std::ios::binary | std::ios::in);
    std::cout<<"current table number : "<<tableNumber<<std::endl;
    //增加文件中标明的table数目
    tablelist.write(reinterpret_cast<char*>(&tableNumber), sizeof(int));
    writeTabletoFile(tableInfo,tablelist);
    tablelist.close();
    addInfoToList(tableInfo);
    std::cout<<"create table successfully!"<<std::endl;
    return true;
}